

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O0

int __thiscall prometheus::Gateway::DeleteForInstance(Gateway *this)

{
  int iVar1;
  pointer this_00;
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  Gateway *local_10;
  Gateway *this_local;
  
  local_10 = this;
  this_00 = ::std::
            unique_ptr<prometheus::detail::CurlWrapper,_std::default_delete<prometheus::detail::CurlWrapper>_>
            ::operator->(&this->curlWrapper_);
  ::std::operator+(local_30,&this->jobUri_);
  ::std::__cxx11::string::string(local_50);
  iVar1 = detail::CurlWrapper::performHttpRequest(this_00,Delete,local_30,(string *)local_50);
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::~string((string *)local_30);
  return iVar1;
}

Assistant:

int Gateway::DeleteForInstance() {
  return curlWrapper_->performHttpRequest(detail::HttpMethod::Delete,
                                          jobUri_ + labels_);
}